

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

RSA * RSA_parse_private_key(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  uint64_t local_38;
  uint64_t version;
  CBS child;
  RSA *ret;
  CBS *cbs_local;
  
  child.len = (size_t)RSA_new();
  if ((RSA *)child.len != (RSA *)0x0) {
    iVar1 = CBS_get_asn1(cbs,(CBS *)&version,0x20000010);
    if ((iVar1 == 0) || (iVar1 = CBS_get_asn1_uint64((CBS *)&version,&local_38), iVar1 == 0)) {
      ERR_put_error(4,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                    ,0x7d);
    }
    else if (local_38 == 0) {
      iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 8));
      if (((((iVar1 != 0) &&
            (iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x10)), iVar1 != 0)) &&
           (iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x18)), iVar1 != 0)) &&
          ((iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x20)), iVar1 != 0 &&
           (iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x28)), iVar1 != 0)))) &&
         ((iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x30)), iVar1 != 0 &&
          ((iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x38)), iVar1 != 0 &&
           (iVar1 = parse_integer((CBS *)&version,(BIGNUM **)(child.len + 0x40)), iVar1 != 0)))))) {
        sVar2 = CBS_len((CBS *)&version);
        if (sVar2 == 0) {
          iVar1 = RSA_check_key((RSA *)child.len);
          if (iVar1 != 0) {
            return (RSA *)child.len;
          }
          ERR_put_error(4,0,0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                        ,0x97);
        }
        else {
          ERR_put_error(4,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                        ,0x92);
        }
      }
    }
    else {
      ERR_put_error(4,0,0x6a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                    ,0x82);
    }
    RSA_free((RSA *)child.len);
  }
  return (RSA *)0x0;
}

Assistant:

RSA *RSA_parse_private_key(CBS *cbs) {
  RSA *ret = RSA_new();
  if (ret == NULL) {
    return NULL;
  }

  CBS child;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&child, &version)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    goto err;
  }

  if (version != kVersionTwoPrime) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_VERSION);
    goto err;
  }

  if (!parse_integer(&child, &ret->n) ||
      !parse_integer(&child, &ret->e) ||
      !parse_integer(&child, &ret->d) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->dmp1) ||
      !parse_integer(&child, &ret->dmq1) ||
      !parse_integer(&child, &ret->iqmp)) {
    goto err;
  }

  if (CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    goto err;
  }

  if (!RSA_check_key(ret)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_RSA_PARAMETERS);
    goto err;
  }

  return ret;

err:
  RSA_free(ret);
  return NULL;
}